

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraInd.c
# Opt level: O3

Aig_Man_t * Fra_FramesWithClasses(Fra_Man_t *p)

{
  char *pcVar1;
  void *pvVar2;
  long lVar3;
  int iVar4;
  Aig_Man_t *p_00;
  size_t sVar5;
  char *pcVar6;
  Aig_Obj_t *pAVar7;
  Vec_Ptr_t *pVVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  Aig_Obj_t *p1;
  uint uVar12;
  int iVar13;
  Aig_Obj_t *pAVar14;
  ulong uVar15;
  Aig_Man_t *pAVar16;
  int iVar17;
  ulong uVar18;
  
  if (p->pManFraig != (Aig_Man_t *)0x0) {
    __assert_fail("p->pManFraig == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraInd.c"
                  ,0x87,"Aig_Man_t *Fra_FramesWithClasses(Fra_Man_t *)");
  }
  pAVar16 = p->pManAig;
  if (pAVar16->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p->pManAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraInd.c"
                  ,0x88,"Aig_Man_t *Fra_FramesWithClasses(Fra_Man_t *)");
  }
  if (pAVar16->nObjs[2] <= pAVar16->nRegs) {
    __assert_fail("Aig_ManRegNum(p->pManAig) < Aig_ManCiNum(p->pManAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraInd.c"
                  ,0x89,"Aig_Man_t *Fra_FramesWithClasses(Fra_Man_t *)");
  }
  p_00 = Aig_ManStart(p->nFramesAll * pAVar16->vObjs->nSize);
  pAVar16 = p->pManAig;
  pcVar1 = pAVar16->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  p_00->pName = pcVar6;
  pcVar1 = pAVar16->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  p_00->pSpec = pcVar6;
  p_00->nRegs = pAVar16->nRegs;
  iVar4 = p->nFramesAll;
  if (0 < iVar4) {
    pAVar7 = p_00->pConst1;
    lVar11 = 0;
    do {
      pAVar14 = p->pManAig->pConst1;
      pvVar2 = (pAVar14->field_5).pData;
      *(Aig_Obj_t **)
       (*(long *)((long)pvVar2 + 0x20) +
       ((long)*(int *)((long)pvVar2 + 0x18) * (long)pAVar14->Id + lVar11) * 8) = pAVar7;
      lVar11 = lVar11 + 1;
    } while (iVar4 != (int)lVar11);
    pAVar16 = p->pManAig;
    if (0 < iVar4) {
      iVar17 = 0;
      do {
        if (pAVar16->nRegs < pAVar16->nObjs[2]) {
          lVar11 = 0;
          do {
            if (pAVar16->vCis->nSize <= lVar11) goto LAB_005d4fae;
            pvVar2 = pAVar16->vCis->pArray[lVar11];
            pAVar7 = Aig_ObjCreateCi(p_00);
            lVar3 = *(long *)((long)pvVar2 + 0x28);
            *(Aig_Obj_t **)
             (*(long *)(lVar3 + 0x20) +
             (long)(*(int *)(lVar3 + 0x18) * *(int *)((long)pvVar2 + 0x24) + iVar17) * 8) = pAVar7;
            lVar11 = lVar11 + 1;
            pAVar16 = p->pManAig;
          } while (lVar11 < (long)pAVar16->nObjs[2] - (long)pAVar16->nRegs);
          iVar4 = p->nFramesAll;
        }
        iVar17 = iVar17 + 1;
      } while (iVar17 < iVar4);
    }
  }
  uVar12 = pAVar16->nObjs[2] - pAVar16->nRegs;
  pVVar8 = pAVar16->vCis;
  if ((int)uVar12 < pVVar8->nSize) {
    uVar18 = (ulong)uVar12;
    do {
      if ((int)uVar12 < 0) goto LAB_005d4fae;
      pvVar2 = pVVar8->pArray[uVar18];
      pAVar7 = Aig_ObjCreateCi(p_00);
      lVar11 = *(long *)((long)pvVar2 + 0x28);
      *(Aig_Obj_t **)
       (*(long *)(lVar11 + 0x20) +
       (long)*(int *)(lVar11 + 0x18) * (long)*(int *)((long)pvVar2 + 0x24) * 8) = pAVar7;
      uVar18 = uVar18 + 1;
      pAVar16 = p->pManAig;
      pVVar8 = pAVar16->vCis;
    } while ((int)uVar18 < pVVar8->nSize);
    iVar4 = p->nFramesAll;
  }
  if (1 < iVar4) {
    iVar4 = 0;
    do {
      uVar12 = pAVar16->nObjs[2] - pAVar16->nRegs;
      pVVar8 = pAVar16->vCis;
      if ((int)uVar12 < pVVar8->nSize) {
        uVar18 = (ulong)uVar12;
        do {
          if ((int)uVar12 < 0) goto LAB_005d4fae;
          Fra_FramesConstrainNode(p_00,(Aig_Obj_t *)pVVar8->pArray[uVar18],iVar4);
          uVar18 = uVar18 + 1;
          pAVar16 = p->pManAig;
          pVVar8 = pAVar16->vCis;
        } while ((int)uVar18 < pVVar8->nSize);
      }
      pVVar8 = pAVar16->vObjs;
      if (0 < pVVar8->nSize) {
        lVar11 = 0;
        do {
          pAVar7 = (Aig_Obj_t *)pVVar8->pArray[lVar11];
          if ((pAVar7 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar7->field_0x18 & 7) - 7))
          {
            if (((ulong)pAVar7 & 1) != 0) goto LAB_005d4fcd;
            uVar18 = (ulong)pAVar7->pFanin0 & 0xfffffffffffffffe;
            if (uVar18 == 0) {
              pAVar14 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar14 = (Aig_Obj_t *)
                        ((ulong)((uint)pAVar7->pFanin0 & 1) ^
                        *(ulong *)(*(long *)(*(long *)(uVar18 + 0x28) + 0x20) +
                                  (long)(*(int *)(*(long *)(uVar18 + 0x28) + 0x18) *
                                         *(int *)(uVar18 + 0x24) + iVar4) * 8));
            }
            uVar18 = (ulong)pAVar7->pFanin1 & 0xfffffffffffffffe;
            if (uVar18 == 0) {
              p1 = (Aig_Obj_t *)0x0;
            }
            else {
              p1 = (Aig_Obj_t *)
                   ((ulong)((uint)pAVar7->pFanin1 & 1) ^
                   *(ulong *)(*(long *)(*(long *)(uVar18 + 0x28) + 0x20) +
                             (long)(*(int *)(*(long *)(uVar18 + 0x28) + 0x18) *
                                    *(int *)(uVar18 + 0x24) + iVar4) * 8));
            }
            pAVar14 = Aig_And(p_00,pAVar14,p1);
            *(Aig_Obj_t **)
             (*(long *)((long)(pAVar7->field_5).pData + 0x20) +
             (long)(*(int *)((long)(pAVar7->field_5).pData + 0x18) * pAVar7->Id + iVar4) * 8) =
                 pAVar14;
            Fra_FramesConstrainNode(p_00,pAVar7,iVar4);
            pAVar16 = p->pManAig;
          }
          lVar11 = lVar11 + 1;
          pVVar8 = pAVar16->vObjs;
        } while (lVar11 < pVVar8->nSize);
      }
      iVar13 = pAVar16->nRegs;
      iVar17 = iVar4 + 1;
      if (0 < iVar13) {
        iVar9 = 0;
        do {
          uVar12 = (pAVar16->nObjs[3] - iVar13) + iVar9;
          if (((((int)uVar12 < 0) || (pAVar16->vCos->nSize <= (int)uVar12)) ||
              (uVar10 = (pAVar16->nObjs[2] - iVar13) + iVar9, (int)uVar10 < 0)) ||
             (pAVar16->vCis->nSize <= (int)uVar10)) goto LAB_005d4fae;
          pvVar2 = pAVar16->vCos->pArray[uVar12];
          if (((ulong)pvVar2 & 1) != 0) {
LAB_005d4fcd:
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fra.h"
                          ,0x110,"Aig_Obj_t *Fra_ObjChild0Fra(Aig_Obj_t *, int)");
          }
          uVar18 = *(ulong *)((long)pvVar2 + 8);
          uVar15 = uVar18 & 0xfffffffffffffffe;
          if (uVar15 == 0) {
            uVar18 = 0;
          }
          else {
            uVar18 = (ulong)((uint)uVar18 & 1) ^
                     *(ulong *)(*(long *)(*(long *)(uVar15 + 0x28) + 0x20) +
                               (long)(*(int *)(*(long *)(uVar15 + 0x28) + 0x18) *
                                      *(int *)(uVar15 + 0x24) + iVar4) * 8);
          }
          pvVar2 = pAVar16->vCis->pArray[uVar10];
          lVar11 = *(long *)((long)pvVar2 + 0x28);
          *(ulong *)(*(long *)(lVar11 + 0x20) +
                    (long)(*(int *)(lVar11 + 0x18) * *(int *)((long)pvVar2 + 0x24) + iVar17) * 8) =
               uVar18;
          iVar9 = iVar9 + 1;
          pAVar16 = p->pManAig;
          iVar13 = pAVar16->nRegs;
        } while (iVar9 < iVar13);
      }
      iVar4 = iVar17;
    } while (iVar17 < p->nFramesAll + -1);
  }
  p_00->nAsserts = p_00->nObjs[3];
  uVar12 = pAVar16->nObjs[2] - pAVar16->nRegs;
  pVVar8 = pAVar16->vCis;
  if ((int)uVar12 < pVVar8->nSize) {
    uVar18 = (ulong)uVar12;
    do {
      if ((int)uVar12 < 0) {
LAB_005d4fae:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      lVar11 = *(long *)((long)pVVar8->pArray[uVar18] + 0x28);
      Aig_ObjCreateCo(p_00,*(Aig_Obj_t **)
                            (*(long *)(lVar11 + 0x20) + -8 +
                            ((long)*(int *)(lVar11 + 0x18) *
                             (long)*(int *)((long)pVVar8->pArray[uVar18] + 0x24) +
                            (long)p->nFramesAll) * 8));
      uVar18 = uVar18 + 1;
      pVVar8 = p->pManAig->vCis;
    } while ((int)uVar18 < pVVar8->nSize);
  }
  Aig_ManCleanup(p_00);
  if (p_00->pData == (void *)0x0) {
    return p_00;
  }
  __assert_fail("pManFraig->pData == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraInd.c"
                ,0xb6,"Aig_Man_t *Fra_FramesWithClasses(Fra_Man_t *)");
}

Assistant:

Aig_Man_t * Fra_FramesWithClasses( Fra_Man_t * p )
{
    Aig_Man_t * pManFraig;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pObjNew;
    int i, k, f;
    assert( p->pManFraig == NULL );
    assert( Aig_ManRegNum(p->pManAig) > 0 );
    assert( Aig_ManRegNum(p->pManAig) < Aig_ManCiNum(p->pManAig) );

    // start the fraig package
    pManFraig = Aig_ManStart( Aig_ManObjNumMax(p->pManAig) * p->nFramesAll );
    pManFraig->pName = Abc_UtilStrsav( p->pManAig->pName );
    pManFraig->pSpec = Abc_UtilStrsav( p->pManAig->pSpec );
    pManFraig->nRegs = p->pManAig->nRegs;
    // create PI nodes for the frames
    for ( f = 0; f < p->nFramesAll; f++ )
        Fra_ObjSetFraig( Aig_ManConst1(p->pManAig), f, Aig_ManConst1(pManFraig) );
    for ( f = 0; f < p->nFramesAll; f++ )
        Aig_ManForEachPiSeq( p->pManAig, pObj, i )
            Fra_ObjSetFraig( pObj, f, Aig_ObjCreateCi(pManFraig) );
    // create latches for the first frame
    Aig_ManForEachLoSeq( p->pManAig, pObj, i )
        Fra_ObjSetFraig( pObj, 0, Aig_ObjCreateCi(pManFraig) );

    // add timeframes
//    pManFraig->fAddStrash = 1;
    for ( f = 0; f < p->nFramesAll - 1; f++ )
    {
        // set the constraints on the latch outputs
        Aig_ManForEachLoSeq( p->pManAig, pObj, i )
            Fra_FramesConstrainNode( pManFraig, pObj, f );
        // add internal nodes of this frame
        Aig_ManForEachNode( p->pManAig, pObj, i )
        {
            pObjNew = Aig_And( pManFraig, Fra_ObjChild0Fra(pObj,f), Fra_ObjChild1Fra(pObj,f) );
            Fra_ObjSetFraig( pObj, f, pObjNew );
            Fra_FramesConstrainNode( pManFraig, pObj, f );
        }
        // transfer latch input to the latch outputs 
        Aig_ManForEachLiLoSeq( p->pManAig, pObjLi, pObjLo, k )
            Fra_ObjSetFraig( pObjLo, f+1, Fra_ObjChild0Fra(pObjLi,f) );
    }
//    pManFraig->fAddStrash = 0;
    // mark the asserts
    pManFraig->nAsserts = Aig_ManCoNum(pManFraig);
    // add the POs for the latch outputs of the last frame
    Aig_ManForEachLoSeq( p->pManAig, pObj, i )
        Aig_ObjCreateCo( pManFraig, Fra_ObjFraig(pObj,p->nFramesAll-1) );

    // remove dangling nodes
    Aig_ManCleanup( pManFraig );
    // make sure the satisfying assignment is node assigned
    assert( pManFraig->pData == NULL );
    return pManFraig;
}